

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O3

GLHorizonInfo * __thiscall
UniqueList<GLHorizonInfo>::Get(UniqueList<GLHorizonInfo> *this,GLHorizonInfo *t)

{
  uint uVar1;
  GLHorizonInfo **ppGVar2;
  double dVar3;
  FVector2 FVar4;
  float fVar5;
  PalEntry PVar6;
  PalEntry PVar7;
  int iVar8;
  GLHorizonInfo *pGVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar11 = (ulong)(this->Array).Count;
  if (uVar11 != 0) {
    ppGVar2 = (this->Array).Array;
    uVar10 = 0;
    do {
      pGVar9 = ppGVar2[uVar10];
      iVar8 = bcmp(t,pGVar9,0x60);
      if (iVar8 == 0) {
        return pGVar9;
      }
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  pGVar9 = (GLHorizonInfo *)operator_new(0x60);
  (pGVar9->plane).texture.texnum = (t->plane).texture.texnum;
  (pGVar9->plane).plane.normal.Z = (t->plane).plane.normal.Z;
  dVar3 = (t->plane).plane.normal.Y;
  (pGVar9->plane).plane.normal.X = (t->plane).plane.normal.X;
  (pGVar9->plane).plane.normal.Y = dVar3;
  dVar3 = (t->plane).plane.negiC;
  (pGVar9->plane).plane.D = (t->plane).plane.D;
  (pGVar9->plane).plane.negiC = dVar3;
  fVar5 = (t->plane).Angle;
  (pGVar9->plane).Texheight = (t->plane).Texheight;
  (pGVar9->plane).Angle = fVar5;
  FVar4 = (t->plane).Scale;
  (pGVar9->plane).Offs = (t->plane).Offs;
  (pGVar9->plane).Scale = FVar4;
  (pGVar9->colormap).blendfactor = (t->colormap).blendfactor;
  PVar6.field_0 = (t->colormap).LightColor.field_0;
  PVar7.field_0 = (t->colormap).FadeColor.field_0;
  iVar8 = (t->colormap).desaturation;
  pGVar9->lightlevel = t->lightlevel;
  (pGVar9->colormap).LightColor = (PalEntry)PVar6.field_0;
  (pGVar9->colormap).FadeColor = (PalEntry)PVar7.field_0;
  (pGVar9->colormap).desaturation = iVar8;
  TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::Grow(&this->Array,1);
  uVar1 = (this->Array).Count;
  (this->Array).Array[uVar1] = pGVar9;
  (this->Array).Count = uVar1 + 1;
  return pGVar9;
}

Assistant:

T * Get(T * t)
	{
		for(unsigned i=0;i<Array.Size();i++)
		{
			if (!memcmp(t, Array[i], sizeof(T))) return Array[i];
		}
		T * newo=TheFreeList.GetNew();

		*newo=*t;
		Array.Push(newo);
		return newo;
	}